

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall
slang::parsing::Lexer::scanDisabledRegion
          (Lexer *this,string_view firstWord,string_view secondWord,
          optional<std::basic_string_view<char,_std::char_traits<char>_>_> thirdWord,
          DiagCode unclosedDiag)

{
  size_type *psVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  size_t sVar5;
  ulong uVar6;
  Diagnostic *this_00;
  byte *pbVar7;
  
  pbVar4 = (byte *)this->sourceBuffer;
LAB_00393239:
  do {
    do {
      do {
        do {
          while (pbVar7 = pbVar4, bVar2 = *pbVar7, bVar2 == 0) {
            if (this->sourceEnd + -1 <= pbVar7) {
              this_00 = Diagnostics::add(this->diagnostics,unclosedDiag,
                                         (SourceLocation)
                                         (((long)pbVar7 -
                                          (long)(this->originalBegin +
                                                (uint)((int)pbVar7 - *(int *)&this->marker))) *
                                          0x10000000 | (ulong)((this->bufferId).id & 0xfffffff)));
              if (unclosedDiag != (DiagCode)0x100002) {
                return;
              }
              Diagnostic::operator<<(this_00,secondWord);
              return;
            }
            this->sourceBuffer = (char *)(pbVar7 + 1);
            pbVar4 = pbVar7 + 1;
          }
          pbVar4 = pbVar7 + 1;
          this->sourceBuffer = (char *)pbVar4;
        } while ((bVar2 != 0x2f) || ((bVar2 = *pbVar4, bVar2 != 0x2f && (bVar2 != 0x2a))));
        pbVar4 = pbVar7 + 2;
        while( true ) {
          this->sourceBuffer = (char *)pbVar4;
          bVar3 = *pbVar4;
          if ((bVar3 != 0x20) && (bVar3 != 9)) break;
          pbVar4 = pbVar4 + 1;
        }
        if (firstWord._M_len != 0) {
          sVar5 = 0;
          do {
            if (*pbVar4 != firstWord._M_str[sVar5]) goto LAB_00393239;
            pbVar4 = pbVar4 + 1;
            this->sourceBuffer = (char *)pbVar4;
            sVar5 = sVar5 + 1;
          } while (firstWord._M_len != sVar5);
          bVar3 = *pbVar4;
        }
        uVar6 = (ulong)bVar3;
      } while ((0x20 < bVar3) || ((0x100003e01U >> (uVar6 & 0x3f) & 1) == 0));
      while ((pbVar7 = pbVar4 + 1, (char)uVar6 == ' ' || ((int)uVar6 == 9))) {
        this->sourceBuffer = (char *)pbVar7;
        pbVar4 = pbVar7;
        uVar6 = (ulong)*pbVar7;
      }
      if (secondWord._M_len != 0) {
        sVar5 = 0;
        do {
          if (*pbVar4 != secondWord._M_str[sVar5]) goto LAB_00393239;
          pbVar4 = pbVar4 + 1;
          this->sourceBuffer = (char *)pbVar4;
          sVar5 = sVar5 + 1;
        } while (secondWord._M_len != sVar5);
        uVar6 = (ulong)*pbVar4;
      }
    } while ((0x20 < (byte)uVar6) || ((0x100003e01U >> (uVar6 & 0x3f) & 1) == 0));
    if (((undefined1  [24])
         thirdWord.
         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
         _M_payload.
         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_> &
        (undefined1  [24])0x1) == (undefined1  [24])0x0) break;
    while ((pbVar7 = pbVar4 + 1, (char)uVar6 == ' ' || ((int)uVar6 == 9))) {
      this->sourceBuffer = (char *)pbVar7;
      pbVar4 = pbVar7;
      uVar6 = (ulong)*pbVar7;
    }
    if (thirdWord.
        super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_payload._M_value._M_len != 0) {
      sVar5 = 0;
      do {
        if (*pbVar4 !=
            thirdWord.
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._M_value._M_str[sVar5]) goto LAB_00393239;
        pbVar4 = pbVar4 + 1;
        this->sourceBuffer = (char *)pbVar4;
        sVar5 = sVar5 + 1;
      } while (thirdWord.
               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
               _M_payload._M_value._M_len != sVar5);
      uVar6 = (ulong)*pbVar4;
    }
  } while ((0x20 < (byte)uVar6) || ((0x100003e01U >> (uVar6 & 0x3f) & 1) == 0));
  if (bVar2 == 0x2a) {
    scanBlockComment(this);
  }
  else {
    scanLineComment(this);
  }
  psVar1 = &(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>.len;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

void Lexer::scanDisabledRegion(std::string_view firstWord, std::string_view secondWord,
                               std::optional<std::string_view> thirdWord, DiagCode unclosedDiag) {
    auto matchWord = [&](std::string_view word) {
        while (isTabOrSpace(peek()))
            advance();

        for (char c : word) {
            if (!consume(c))
                return false;
        }

        char c = peek();
        return isWhitespace(c) || c == '\0';
    };

    while (true) {
        char c = peek();
        if (c == '\0' && reallyAtEnd()) {
            auto& diag = addDiag(unclosedDiag, currentOffset() - lexemeLength());
            if (unclosedDiag == diag::UnclosedTranslateOff)
                diag << secondWord;
            return;
        }

        advance();
        if (c == '/' && (peek() == '/' || peek() == '*')) {
            const bool isBlockComment = peek() == '*';
            advance();

            if (matchWord(firstWord) && matchWord(secondWord)) {
                if (!thirdWord || matchWord(*thirdWord)) {
                    // Scan the rest of the comment and then return.
                    // We discard the comment trivia from the buffer
                    // so that this part of the region ends up as
                    // a DisabledText trivia instead.
                    if (isBlockComment)
                        scanBlockComment();
                    else
                        scanLineComment();
                    triviaBuffer.pop_back();
                    return;
                }
            }
        }
    }
}